

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O2

APInt * __thiscall llvm::APInt::operator|=(APInt *this,uint64_t RHS)

{
  if (this->BitWidth < 0x41) {
    (this->U).VAL = (this->U).VAL | RHS;
    clearUnusedBits(this);
  }
  else {
    *(this->U).pVal = *(this->U).pVal | RHS;
  }
  return this;
}

Assistant:

APInt &operator|=(uint64_t RHS) {
    if (isSingleWord()) {
      U.VAL |= RHS;
      clearUnusedBits();
    } else {
      U.pVal[0] |= RHS;
    }
    return *this;
  }